

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O1

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,LambdaNode *node)

{
  SymbolTable *this_00;
  TypeName TVar1;
  element_type *peVar2;
  LambdaNode *pLVar3;
  SemanticAnalyser *pSVar4;
  tuple<Symbol_*,_std::default_delete<Symbol>_> tVar5;
  _Elt_pointer pRVar6;
  mapped_type *pmVar7;
  long *plVar8;
  size_type *psVar9;
  _List_node_base *p_Var10;
  value_type returnInfo;
  __uniq_ptr_impl<Symbol,_std::default_delete<Symbol>_> local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  LambdaNode *local_c8;
  string local_c0;
  SemanticAnalyser *local_a0;
  stack<SemanticAnalyser::ReturnInfo,_std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>_>
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = &this->hasReturn_;
  local_c0._M_dataplus._M_p = local_c0._M_dataplus._M_p & 0xffffffffffffff00;
  local_c0._M_string_length = local_c0._M_string_length & 0xffffffffffffff00;
  std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>::
  emplace_back<SemanticAnalyser::ReturnInfo>(&local_98->c,(ReturnInfo *)&local_c0);
  this_00 = &this->symbols_;
  local_a0 = this;
  SymbolTable::enterScope(this_00);
  p_Var10 = (node->arguments_).
            super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  local_c8 = node;
  if (p_Var10 != (_List_node_base *)&node->arguments_) {
    do {
      tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)operator_new(0x30);
      *(undefined ***)
       tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
       super__Head_base<0UL,_Symbol_*,_false>._M_head_impl = &PTR__VariableSymbol_001f4678;
      *(long **)((long)tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                       super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8) =
           (long *)((long)tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                          super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 0x18);
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                        super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8),p_Var10[1]._M_next,
                 (long)&(p_Var10[1]._M_prev)->_M_next + (long)p_Var10[1]._M_next);
      *(undefined4 *)
       ((long)tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
              super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 0x28) =
           *(undefined4 *)&p_Var10[3]._M_next;
      local_e0._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
           (tuple<Symbol_*,_std::default_delete<Symbol>_>)
           (tuple<Symbol_*,_std::default_delete<Symbol>_>)
           tVar5.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
           super__Head_base<0UL,_Symbol_*,_false>._M_head_impl;
      SymbolTable::addSymbol
                (this_00,(string *)(p_Var10 + 1),
                 (unique_ptr<Symbol,_std::default_delete<Symbol>_> *)&local_e0);
      if ((_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)
          local_e0._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
          super__Head_base<0UL,_Symbol_*,_false>._M_head_impl != (Symbol *)0x0) {
        (**(code **)(*(long *)local_e0._M_t.
                              super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
                              super__Head_base<0UL,_Symbol_*,_false>._M_head_impl + 8))();
      }
      local_e0._M_t.super__Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>.
      super__Head_base<0UL,_Symbol_*,_false>._M_head_impl =
           (tuple<Symbol_*,_std::default_delete<Symbol>_>)
           (_Tuple_impl<0UL,_Symbol_*,_std::default_delete<Symbol>_>)0x0;
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&node->arguments_);
  }
  pSVar4 = local_a0;
  pLVar3 = local_c8;
  peVar2 = (local_c8->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_StatementNode).super_Node._vptr_Node[2])(peVar2,local_a0);
  SymbolTable::leaveScope(this_00);
  pRVar6 = (pSVar4->hasReturn_).c.
           super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pRVar6 == (pSVar4->hasReturn_).c.
                super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pRVar6 = (pSVar4->hasReturn_).c.
             super__Deque_base<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
  }
  local_d0 = *(undefined4 *)
              &pRVar6[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
               super__Optional_payload_base<TypeName>._M_engaged;
  local_d8._0_1_ = pRVar6[-1].hasReturn;
  local_d8._1_3_ = *(undefined3 *)&pRVar6[-1].field_0x1;
  local_d8._4_4_ =
       *(TypeName *)
        &pRVar6[-1].type.super__Optional_base<TypeName,_true,_true>._M_payload.
         super__Optional_payload_base<TypeName>._M_payload;
  std::deque<SemanticAnalyser::ReturnInfo,_std::allocator<SemanticAnalyser::ReturnInfo>_>::pop_back
            (&local_98->c);
  TVar1 = pLVar3->returnType_;
  if (TVar1 != Void) {
    if ((char)local_d8 == '\0') {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Lambda does not return any value!","");
      reportError(&local_c0,(Node *)local_c8);
    }
    if (TVar1 != Void) goto LAB_0015b7d9;
  }
  if ((char)local_d8 == '\x01') {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"Void lambda does return!","");
    reportError(&local_c0,(Node *)local_c8);
  }
  if (TVar1 == Void) {
    return;
  }
LAB_0015b7d9:
  if (((char)local_d0 != '\x01') || (TVar1 == local_d8._4_4_)) {
    return;
  }
  pmVar7 = std::__detail::
           _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&TypeNameStrings_abi_cxx11_,&pLVar3->returnType_);
  std::operator+(&local_50,"Lambda should return ",pmVar7);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar9) {
    local_90.field_2._M_allocated_capacity = *psVar9;
    local_90.field_2._8_8_ = plVar8[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar9;
  }
  local_90._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((char)local_d0 == '\0') {
    std::__throw_bad_optional_access();
  }
  pmVar7 = std::__detail::
           _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&TypeNameStrings_abi_cxx11_,(key_type *)((long)&local_d8 + 4));
  std::operator+(&local_70,&local_90,pmVar7);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_c0._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_c0._M_dataplus._M_p == psVar9) {
    local_c0.field_2._M_allocated_capacity = *psVar9;
    local_c0.field_2._8_8_ = plVar8[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar9;
  }
  local_c0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  reportError(&local_c0,(Node *)local_c8);
}

Assistant:

void SemanticAnalyser::visit(const LambdaNode& node) 
{
  hasReturn_.push({});
  symbols_.enterScope();

  for(const auto& arg : node.getArguments())
  {
    symbols_.addSymbol(arg.first, std::make_unique<VariableSymbol>(arg.first, arg.second));
  }

  node.getBody().accept(*this);

  symbols_.leaveScope();
  const auto returnInfo = hasReturn_.top();
  hasReturn_.pop();

  if(node.getReturnType() != TypeName::Void && !returnInfo.hasReturn)
    reportError("Lambda does not return any value!", node);
  else if(node.getReturnType() == TypeName::Void && returnInfo.hasReturn)
    reportError("Void lambda does return!", node);
  else if(node.getReturnType() != TypeName::Void && 
    returnInfo.type.has_value() && node.getReturnType() != returnInfo.type.value())
    reportError("Lambda should return " + 
      TypeNameStrings.at(node.getReturnType()) + ", but returns " + 
        TypeNameStrings.at(returnInfo.type.value()) + "!", node);
}